

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ri_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  undefined1 *puVar1;
  PackedSize<12UL> PVar2;
  ushort uVar3;
  SSL *ssl;
  SSL3_STATE *pSVar4;
  uint16_t uVar5;
  int iVar6;
  CBS renegotiated_connection;
  CBS server_verify;
  CBS client_verify;
  
  ssl = hs->ssl;
  if ((contents != (CBS *)0x0) && (uVar5 = ssl_protocol_version(ssl), 0x303 < uVar5)) {
    *out_alert = '/';
    return false;
  }
  pSVar4 = ssl->s3;
  uVar3 = *(ushort *)&pSVar4->field_0xdc;
  if (((uVar3 & 0x10) != 0) && (((uVar3 & 0x40) == 0) == (contents != (CBS *)0x0))) {
    *out_alert = '(';
    ERR_put_error(0x10,0,0xca,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x2ce);
    return false;
  }
  if (contents == (CBS *)0x0) {
    return true;
  }
  PVar2 = (pSVar4->previous_client_finished).size_;
  if (PVar2 != (pSVar4->previous_server_finished).size_) {
    __assert_fail("ssl->s3->previous_client_finished.size() == ssl->s3->previous_server_finished.size()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x2df,"bool bssl::ext_ri_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
  }
  if (SUB41((uVar3 & 0x10) >> 4,0) == (PVar2 == '\0')) {
    __assert_fail("ssl->s3->initial_handshake_complete == !ssl->s3->previous_client_finished.empty()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x2e1,"bool bssl::ext_ri_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
  }
  iVar6 = CBS_get_u8_length_prefixed(contents,&renegotiated_connection);
  if ((iVar6 != 0) && (contents->len == 0)) {
    iVar6 = CBS_get_bytes(&renegotiated_connection,&client_verify,
                          (ulong)(ssl->s3->previous_client_finished).size_);
    if (((iVar6 == 0) ||
        (iVar6 = CBS_get_bytes(&renegotiated_connection,&server_verify,
                               (ulong)(ssl->s3->previous_server_finished).size_), iVar6 == 0)) ||
       (renegotiated_connection.len != 0)) {
      iVar6 = 0x2f3;
    }
    else {
      iVar6 = CBS_mem_equal(&client_verify,(uint8_t *)&ssl->s3->previous_client_finished,
                            (ulong)(ssl->s3->previous_client_finished).size_);
      if ((iVar6 != 0) &&
         (iVar6 = CBS_mem_equal(&server_verify,(uint8_t *)&ssl->s3->previous_server_finished,
                                (ulong)(ssl->s3->previous_server_finished).size_), iVar6 != 0)) {
        puVar1 = &ssl->s3->field_0xdc;
        *(ushort *)puVar1 = *(ushort *)puVar1 | 0x40;
        return true;
      }
      iVar6 = 0x301;
    }
    ERR_put_error(0x10,0,0xca,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,iVar6);
    *out_alert = '(';
    return false;
  }
  ERR_put_error(0x10,0,0xc9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0x2e7);
  *out_alert = '/';
  return false;
}

Assistant:

static bool ext_ri_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                     CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents != NULL && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // Servers may not switch between omitting the extension and supporting it.
  // See RFC 5746, sections 3.5 and 4.2.
  if (ssl->s3->initial_handshake_complete &&
      (contents != NULL) != ssl->s3->send_connection_binding) {
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    return false;
  }

  if (contents == NULL) {
    // Strictly speaking, if we want to avoid an attack we should *always* see
    // RI even on initial ServerHello because the client doesn't see any
    // renegotiation during an attack. However this would mean we could not
    // connect to any server which doesn't support RI.
    //
    // OpenSSL has |SSL_OP_LEGACY_SERVER_CONNECT| to control this, but in
    // practical terms every client sets it so it's just assumed here.
    return true;
  }

  // Check for logic errors.
  assert(ssl->s3->previous_client_finished.size() ==
         ssl->s3->previous_server_finished.size());
  assert(ssl->s3->initial_handshake_complete ==
         !ssl->s3->previous_client_finished.empty());

  // Parse out the extension contents.
  CBS renegotiated_connection;
  if (!CBS_get_u8_length_prefixed(contents, &renegotiated_connection) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_ENCODING_ERR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // Check that the extension matches.
  CBS client_verify, server_verify;
  if (!CBS_get_bytes(&renegotiated_connection, &client_verify,
                     ssl->s3->previous_client_finished.size()) ||
      !CBS_get_bytes(&renegotiated_connection, &server_verify,
                     ssl->s3->previous_server_finished.size()) ||
      CBS_len(&renegotiated_connection) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    return false;
  }

  bool ok =
      CBS_mem_equal(&client_verify, ssl->s3->previous_client_finished.data(),
                    ssl->s3->previous_client_finished.size()) &&
      CBS_mem_equal(&server_verify, ssl->s3->previous_server_finished.data(),
                    ssl->s3->previous_server_finished.size());
  if (CRYPTO_fuzzer_mode_enabled()) {
    ok = true;
  }
  if (!ok) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    return false;
  }

  ssl->s3->send_connection_binding = true;
  return true;
}